

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

CallOrCast * __thiscall
soul::PoolAllocator::
allocate<soul::AST::CallOrCast,soul::AST::QualifiedIdentifier&,soul::pool_ptr<soul::AST::CommaSeparatedList>&,bool>
          (PoolAllocator *this,QualifiedIdentifier *args,
          pool_ptr<soul::AST::CommaSeparatedList> *args_1,bool *args_2)

{
  PoolItem *pPVar1;
  pool_ptr<soul::AST::CommaSeparatedList> local_30;
  
  pPVar1 = allocateSpaceForObject(this,0x48);
  local_30 = (pool_ptr<soul::AST::CommaSeparatedList>)args_1->object;
  AST::CallOrCast::CallOrCast((CallOrCast *)&pPVar1->item,&args->super_Expression,&local_30,*args_2)
  ;
  pPVar1->destructor =
       allocate<soul::AST::CallOrCast,_soul::AST::QualifiedIdentifier_&,_soul::pool_ptr<soul::AST::CommaSeparatedList>_&,_bool>
       ::anon_class_1_0_00000001::__invoke;
  return (CallOrCast *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }